

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_StArrWasm<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined2 uVar6;
  uint32 byteLength;
  int iVar7;
  undefined4 uVar8;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar9;
  WebAssemblyMemory *pWVar10;
  ArrayBufferBase *pAVar11;
  undefined4 extraout_var;
  uint64 index;
  long lVar12;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23aa,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar4) goto LAB_0096bbe6;
    *puVar9 = 0;
  }
  uVar1 = playout->Offset;
  uVar2 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  pWVar10 = GetWebAssemblyMemory(this);
  pAVar11 = WebAssemblyMemory::GetBuffer(pWVar10);
  byteLength = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar11);
  iVar7 = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar11);
  lVar12 = CONCAT44(extraout_var,iVar7);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23b8,"((0))","UNREACHED");
    if (!bVar4) {
LAB_0096bbe6:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
    goto LAB_0096bb32;
  }
  index = (ulong)uVar2 + (ulong)uVar1;
  switch(playout->ViewType) {
  case TYPE_INT8:
    WasmArrayBoundsCheck<char>(this,index,byteLength);
    goto LAB_0096ba99;
  case TYPE_UINT8:
    WasmArrayBoundsCheck<unsigned_char>(this,index,byteLength);
LAB_0096ba99:
    uVar5 = *(undefined1 *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
LAB_0096bb2e:
    *(undefined1 *)(lVar12 + index) = uVar5;
    break;
  case TYPE_INT16:
    WasmArrayBoundsCheck<short>(this,index,byteLength);
    goto LAB_0096ba49;
  case TYPE_UINT16:
    WasmArrayBoundsCheck<unsigned_short>(this,index,byteLength);
LAB_0096ba49:
    uVar6 = *(undefined2 *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
LAB_0096ba58:
    *(undefined2 *)(lVar12 + index) = uVar6;
    break;
  case TYPE_INT32:
    WasmArrayBoundsCheck<int>(this,index,byteLength);
    goto LAB_0096baba;
  case TYPE_UINT32:
    WasmArrayBoundsCheck<unsigned_int>(this,index,byteLength);
LAB_0096baba:
    uVar8 = *(undefined4 *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
LAB_0096bae6:
    *(undefined4 *)(lVar12 + index) = uVar8;
    break;
  case TYPE_FLOAT32:
    WasmArrayBoundsCheck<float>(this,index,byteLength);
    *(undefined4 *)(lVar12 + index) =
         *(undefined4 *)(*(long *)(this + 0x130) + (ulong)playout->Value * 4);
    break;
  case TYPE_FLOAT64:
    WasmArrayBoundsCheck<double>(this,index,byteLength);
    *(undefined8 *)(lVar12 + index) =
         *(undefined8 *)(*(long *)(this + 0x128) + (ulong)playout->Value * 8);
    break;
  case TYPE_INT64:
    WasmArrayBoundsCheck<long>(this,index,byteLength);
    *(undefined8 *)(lVar12 + index) =
         *(undefined8 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
    break;
  case TYPE_INT8_TO_INT64:
    WasmArrayBoundsCheck<char>(this,index,byteLength);
    goto LAB_0096bb20;
  case TYPE_UINT8_TO_INT64:
    WasmArrayBoundsCheck<unsigned_char>(this,index,byteLength);
LAB_0096bb20:
    uVar5 = *(undefined1 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
    goto LAB_0096bb2e;
  case TYPE_INT16_TO_INT64:
    WasmArrayBoundsCheck<short>(this,index,byteLength);
    goto LAB_0096b9ad;
  case TYPE_UINT16_TO_INT64:
    WasmArrayBoundsCheck<unsigned_short>(this,index,byteLength);
LAB_0096b9ad:
    uVar6 = *(undefined2 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
    goto LAB_0096ba58;
  case TYPE_INT32_TO_INT64:
    WasmArrayBoundsCheck<int>(this,index,byteLength);
    goto LAB_0096bad8;
  case TYPE_UINT32_TO_INT64:
    WasmArrayBoundsCheck<unsigned_int>(this,index,byteLength);
LAB_0096bad8:
    uVar8 = *(undefined4 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
    goto LAB_0096bae6;
  }
LAB_0096bb32:
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  functionId = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(this + 0x88));
  bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,WasmMemWritesPhase,sourceContextId,functionId);
  if (bVar4) {
    GetWebAssemblyMemory(this);
    pWVar10 = GetWebAssemblyMemory(this);
    WebAssemblyMemory::TraceMemWrite
              (pWVar10,*(uint32 *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4),
               playout->Offset,playout->ViewType,*(uint32 *)(this + 0x108),
               *(ScriptContext **)(this + 0x78));
    return;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_StArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            *(MemType*)(buffer + index) = (MemType)(GetRegRaw<RegType>(playout->Value)); \
            break;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
        CompileAssert(ArrayBufferView::ViewType::TYPE_COUNT == 15);
#if DBG
        if (PHASE_TRACE(WasmMemWritesPhase, m_functionBody))
        {
            GetWebAssemblyMemory()->TraceMemWrite(GetWebAssemblyMemory(), (uint32)GetRegRawInt(playout->SlotIndex), playout->Offset, playout->ViewType, (uint32)(size_t)this->DEBUG_currentByteOffset, scriptContext);
        }
#endif
        return;
#else
        Assert(UNREACHED);
#endif
    }